

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O2

void __thiscall FlowInfo::xrefInlinedBranch(FlowInfo *this,PcodeOp *op)

{
  OpCode OVar1;
  JumpTable *pJVar2;
  PcodeOp *op_local;
  
  OVar1 = op->opcode->opcode;
  op_local = op;
  if (OVar1 == CPUI_BRANCHIND) {
    pJVar2 = Funcdata::linkJumpTable(this->data,op);
    if (pJVar2 == (JumpTable *)0x0) {
      std::vector<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(&this->tablelist,&op_local);
    }
  }
  else {
    if (OVar1 == CPUI_CALLIND) {
      setupCallindSpecs(this,op,true,(FuncCallSpecs *)0x0);
      return;
    }
    if (OVar1 == CPUI_CALL) {
      setupCallSpecs(this,op,(FuncCallSpecs *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void FlowInfo::xrefInlinedBranch(PcodeOp *op)

{
  if (op->code() == CPUI_CALL)
    setupCallSpecs(op,(FuncCallSpecs *)0);
  else if (op->code() == CPUI_CALLIND)
    setupCallindSpecs(op,true,(FuncCallSpecs *)0);
  else if (op->code() == CPUI_BRANCHIND) {
    JumpTable *jt = data.linkJumpTable(op);
    if (jt == (JumpTable *)0)
      tablelist.push_back(op); // Didn't recover a jumptable
  }
}